

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_avx2_256_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_striped_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  uint uVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  __m256i alVar10;
  parasail_result_t *ppVar11;
  __m256i *palVar12;
  __m256i *ptr;
  __m256i *ptr_00;
  int16_t *ptr_01;
  int iVar13;
  undefined4 uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  __m256i *palVar18;
  long lVar19;
  __m256i *palVar20;
  int iVar21;
  ulong size;
  short sVar22;
  int iVar23;
  undefined2 uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar38 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 local_98 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_striped_profile_avx2_256_16_cold_8();
  }
  else {
    pvVar2 = (profile->profile16).score;
    if (pvVar2 == (void *)0x0) {
      parasail_nw_striped_profile_avx2_256_16_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_nw_striped_profile_avx2_256_16_cold_6();
      }
      else {
        uVar1 = profile->s1Len;
        if ((int)uVar1 < 1) {
          parasail_nw_striped_profile_avx2_256_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_striped_profile_avx2_256_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_striped_profile_avx2_256_16_cold_3();
        }
        else if (open < 0) {
          parasail_nw_striped_profile_avx2_256_16_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_striped_profile_avx2_256_16_cold_1();
        }
        else {
          uVar15 = uVar1 - 1;
          size = (ulong)uVar1 + 0xf >> 4;
          iVar16 = -open;
          iVar23 = ppVar3->min;
          iVar21 = -iVar23;
          if (iVar23 != iVar16 && SBORROW4(iVar23,iVar16) == iVar23 + open < 0) {
            iVar21 = open;
          }
          sVar22 = 0x7ffe - (short)ppVar3->max;
          ppVar11 = parasail_result_new();
          if (ppVar11 != (parasail_result_t *)0x0) {
            iVar23 = (int)(uVar15 / size);
            ppVar11->flag = ppVar11->flag | 0x10200801;
            palVar12 = parasail_memalign___m256i(0x20,size);
            ptr = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign_int16_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_01 != (int16_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                (ptr != (__m256i *)0x0 && palVar12 != (__m256i *)0x0)) {
              iVar13 = s2Len + -1;
              uVar24 = (undefined2)open;
              auVar31._2_2_ = uVar24;
              auVar31._0_2_ = uVar24;
              auVar31._4_2_ = uVar24;
              auVar31._6_2_ = uVar24;
              auVar31._8_2_ = uVar24;
              auVar31._10_2_ = uVar24;
              auVar31._12_2_ = uVar24;
              auVar31._14_2_ = uVar24;
              auVar31._16_2_ = uVar24;
              auVar31._18_2_ = uVar24;
              auVar31._20_2_ = uVar24;
              auVar31._22_2_ = uVar24;
              auVar31._24_2_ = uVar24;
              auVar31._26_2_ = uVar24;
              auVar31._28_2_ = uVar24;
              auVar31._30_2_ = uVar24;
              uVar24 = (undefined2)gap;
              auVar32._2_2_ = uVar24;
              auVar32._0_2_ = uVar24;
              auVar32._4_2_ = uVar24;
              auVar32._6_2_ = uVar24;
              auVar32._8_2_ = uVar24;
              auVar32._10_2_ = uVar24;
              auVar32._12_2_ = uVar24;
              auVar32._14_2_ = uVar24;
              auVar32._16_2_ = uVar24;
              auVar32._18_2_ = uVar24;
              auVar32._20_2_ = uVar24;
              auVar32._22_2_ = uVar24;
              auVar32._24_2_ = uVar24;
              auVar32._26_2_ = uVar24;
              auVar32._28_2_ = uVar24;
              auVar32._30_2_ = uVar24;
              uVar24 = (undefined2)(iVar21 + -0x7fff);
              auVar39._4_4_ = 0;
              auVar39._0_4_ = open;
              auVar25._4_4_ = 0;
              auVar25._0_4_ = gap;
              lVar19 = (long)iVar16;
              auVar25._8_4_ = gap;
              auVar25._12_4_ = 0;
              auVar25._16_4_ = gap;
              auVar25._20_4_ = 0;
              auVar25._24_4_ = gap;
              auVar25._28_4_ = 0;
              auVar29._8_8_ = lVar19;
              auVar29._0_8_ = lVar19;
              auVar29._16_8_ = lVar19;
              auVar29._24_8_ = lVar19;
              auVar26._8_8_ = size;
              auVar26._0_8_ = size;
              auVar26._16_8_ = size;
              auVar26._24_8_ = size;
              auVar6 = vpmuldq_avx2(auVar26,_DAT_00908e00);
              auVar7 = vpmuldq_avx2(auVar26,_DAT_00908e20);
              auVar36 = vpmuldq_avx2(auVar26,_DAT_00908c60);
              auVar26 = vpmuldq_avx2(auVar26,_DAT_00908b60);
              auVar39._8_4_ = open;
              auVar39._12_4_ = 0;
              auVar39._16_4_ = open;
              auVar39._20_4_ = 0;
              auVar39._24_4_ = open;
              auVar39._28_4_ = 0;
              uVar17 = 0;
              auVar40._8_8_ = 0xffffffffffff8000;
              auVar40._0_8_ = 0xffffffffffff8000;
              auVar40._16_8_ = 0xffffffffffff8000;
              auVar40._24_8_ = 0xffffffffffff8000;
              palVar18 = palVar12;
              palVar20 = ptr_00;
              do {
                auVar42._8_8_ = uVar17;
                auVar42._0_8_ = uVar17;
                auVar42._16_8_ = uVar17;
                auVar42._24_8_ = uVar17;
                auVar43 = vpaddq_avx2(auVar42,auVar36);
                auVar45 = vpaddq_avx2(auVar42,auVar26);
                auVar46 = vpaddq_avx2(auVar42,auVar7);
                auVar42 = vpaddq_avx2(auVar42,auVar6);
                auVar8 = vpmuludq_avx2(auVar42,auVar25);
                auVar42 = vpsrlq_avx2(auVar42,0x20);
                auVar42 = vpmuludq_avx2(auVar42,auVar25);
                auVar42 = vpsllq_avx2(auVar42,0x20);
                auVar42 = vpaddq_avx2(auVar8,auVar42);
                auVar8 = vpmuludq_avx2(auVar46,auVar25);
                auVar46 = vpsrlq_avx2(auVar46,0x20);
                auVar46 = vpmuludq_avx2(auVar46,auVar25);
                auVar46 = vpsllq_avx2(auVar46,0x20);
                auVar8 = vpaddq_avx2(auVar8,auVar46);
                auVar46 = vpmuludq_avx2(auVar45,auVar25);
                auVar45 = vpsrlq_avx2(auVar45,0x20);
                auVar45 = vpmuludq_avx2(auVar45,auVar25);
                auVar45 = vpsllq_avx2(auVar45,0x20);
                auVar45 = vpaddq_avx2(auVar46,auVar45);
                auVar46 = vpmuludq_avx2(auVar43,auVar25);
                auVar43 = vpsrlq_avx2(auVar43,0x20);
                auVar43 = vpmuludq_avx2(auVar43,auVar25);
                auVar43 = vpsllq_avx2(auVar43,0x20);
                auVar46 = vpaddq_avx2(auVar46,auVar43);
                auVar42 = vpsubq_avx2(auVar29,auVar42);
                auVar43 = vpcmpgtq_avx2(auVar42,auVar40);
                auVar43 = vblendvpd_avx(auVar40,auVar42,auVar43);
                auVar27 = vpsubq_avx2(auVar29,auVar45);
                auVar45 = vpcmpgtq_avx2(auVar27,auVar40);
                auVar45 = vblendvpd_avx(auVar40,auVar27,auVar45);
                auVar37 = vpsubq_avx2(auVar29,auVar46);
                auVar46 = vpcmpgtq_avx2(auVar37,auVar40);
                auVar46 = vblendvpd_avx(auVar40,auVar37,auVar46);
                auVar9 = vpsubq_avx2(auVar29,auVar8);
                auVar41 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                auVar46 = vpblendw_avx2(auVar41,auVar46,0x11);
                auVar45 = vpblendw_avx2(auVar41,auVar45,0x11);
                auVar8 = vpackusdw_avx2(auVar45,auVar46);
                auVar45 = vpcmpgtq_avx2(auVar9,auVar40);
                auVar45 = vblendvpd_avx(auVar40,auVar9,auVar45);
                auVar45 = vpblendw_avx2(auVar41,auVar45,0x11);
                auVar43 = vpblendw_avx2(auVar41,auVar43,0x11);
                auVar5 = vpackusdw_avx2(auVar45,auVar43);
                auVar37 = vpsubq_avx2(auVar37,auVar39);
                auVar27 = vpsubq_avx2(auVar27,auVar39);
                auVar45 = vpsubq_avx2(auVar42,auVar39);
                auVar43 = vpcmpgtq_avx2(auVar45,auVar40);
                auVar43 = vblendvpd_avx(auVar40,auVar45,auVar43);
                auVar46 = vpsubq_avx2(auVar9,auVar39);
                auVar45 = vpcmpgtq_avx2(auVar46,auVar40);
                auVar45 = vblendvpd_avx(auVar40,auVar46,auVar45);
                auVar46 = vpcmpgtq_avx2(auVar27,auVar40);
                auVar46 = vblendvpd_avx(auVar40,auVar27,auVar46);
                auVar27 = vpcmpgtq_avx2(auVar37,auVar40);
                auVar42 = vblendvpd_avx(auVar40,auVar37,auVar27);
                auVar8 = vpermq_avx2(auVar8,0xd8);
                auVar5 = vpermq_avx2(auVar5,0xd8);
                auVar8 = vpackusdw_avx2(auVar8,auVar5);
                auVar42 = vpblendw_avx2(auVar41,auVar42,0x11);
                auVar46 = vpblendw_avx2(auVar41,auVar46,0x11);
                auVar46 = vpackusdw_avx2(auVar46,auVar42);
                auVar42 = vpblendw_avx2(auVar41,auVar45,0x11);
                auVar43 = vpblendw_avx2(auVar41,auVar43,0x11);
                auVar43 = vpackusdw_avx2(auVar42,auVar43);
                alVar10 = (__m256i)vpermq_avx2(auVar8,0xd8);
                *palVar18 = alVar10;
                auVar46 = vpermq_avx2(auVar46,0xd8);
                auVar43 = vpermq_avx2(auVar43,0xd8);
                auVar43 = vpackusdw_avx2(auVar46,auVar43);
                alVar10 = (__m256i)vpermq_avx2(auVar43,0xd8);
                *palVar20 = alVar10;
                uVar17 = uVar17 + 1;
                palVar20 = palVar20 + 1;
                palVar18 = palVar18 + 1;
              } while (size != uVar17);
              *ptr_01 = 0;
              lVar19 = (ulong)(uint)s2Len - 1;
              auVar33._8_8_ = lVar19;
              auVar33._0_8_ = lVar19;
              auVar43._16_8_ = lVar19;
              auVar43._0_16_ = auVar33;
              auVar43._24_8_ = lVar19;
              local_98._4_4_ = gap;
              local_98._0_4_ = gap;
              local_98._8_4_ = gap;
              local_98._12_4_ = gap;
              local_98._16_4_ = gap;
              local_98._20_4_ = gap;
              local_98._24_4_ = gap;
              local_98._28_4_ = gap;
              auVar7 = vpmovsxbd_avx2(ZEXT816(0x100f0e0d0c0b0a09));
              auVar6 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
              uVar17 = 0;
              auVar44._8_8_ = 0x8000000000000000;
              auVar44._0_8_ = 0x8000000000000000;
              auVar34 = vpcmpeqd_avx(auVar45._0_16_,auVar45._0_16_);
              auVar36 = vpcmpeqd_avx2(auVar27,auVar27);
              auVar45._8_8_ = 0x8000000000000000;
              auVar45._0_8_ = 0x8000000000000000;
              auVar45._16_8_ = 0x8000000000000000;
              auVar45._24_8_ = 0x8000000000000000;
              auVar26 = ZEXT1632(CONCAT412(4,CONCAT48(4,0x400000004)));
              auVar46._8_4_ = 0x10;
              auVar46._0_8_ = 0x1000000010;
              auVar46._12_4_ = 0x10;
              auVar46._16_4_ = 0x10;
              auVar46._20_4_ = 0x10;
              auVar46._24_4_ = 0x10;
              auVar46._28_4_ = 0x10;
              do {
                auVar27._8_8_ = uVar17;
                auVar27._0_8_ = uVar17;
                auVar27._16_8_ = uVar17;
                auVar27._24_8_ = uVar17;
                auVar39 = vpor_avx2(auVar27,_DAT_00908b60);
                auVar4 = vpcmpgtq_avx(auVar44 ^ auVar39._0_16_,auVar44 ^ auVar33);
                auVar4 = vpackssdw_avx(auVar4,auVar4);
                auVar4 = vpackssdw_avx(auVar34 ^ auVar4,auVar34 ^ auVar4);
                auVar4 = vpacksswb_avx(auVar4,auVar4);
                auVar25 = vpaddd_avx2(auVar6,auVar36);
                auVar29 = vpaddd_avx2(auVar36,auVar7);
                auVar29 = vpmulld_avx2(auVar29,local_98);
                auVar25 = vpmulld_avx2(auVar25,local_98);
                auVar8._4_4_ = iVar16;
                auVar8._0_4_ = iVar16;
                auVar8._8_4_ = iVar16;
                auVar8._12_4_ = iVar16;
                auVar8._16_4_ = iVar16;
                auVar8._20_4_ = iVar16;
                auVar8._24_4_ = iVar16;
                auVar8._28_4_ = iVar16;
                auVar25 = vpsubd_avx2(auVar8,auVar25);
                auVar29 = vpsubd_avx2(auVar8,auVar29);
                auVar5._8_4_ = 0xffff8000;
                auVar5._0_8_ = 0xffff8000ffff8000;
                auVar5._12_4_ = 0xffff8000;
                auVar5._16_4_ = 0xffff8000;
                auVar5._20_4_ = 0xffff8000;
                auVar5._24_4_ = 0xffff8000;
                auVar5._28_4_ = 0xffff8000;
                auVar29 = vpmaxsd_avx2(auVar29,auVar5);
                auVar25 = vpmaxsd_avx2(auVar25,auVar5);
                auVar25 = vpblendw_avx2(auVar25,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
                auVar29 = vpblendw_avx2(auVar29,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
                auVar25 = vpackusdw_avx2(auVar25,auVar29);
                auVar25 = vpermq_avx2(auVar25,0xd8);
                auVar38 = auVar25._0_16_;
                if ((auVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar38,0);
                }
                auVar4 = vpcmpgtq_avx(auVar44 ^ auVar39._0_16_,auVar44 ^ auVar33);
                auVar4 = vpackssdw_avx(auVar4,auVar4);
                auVar4 = vpackssdw_avx(auVar34 ^ auVar4,auVar34 ^ auVar4);
                auVar4 = vpacksswb_avx(auVar4,auVar4);
                if ((auVar4 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar38,1);
                }
                auVar40 = auVar45 ^ auVar43;
                auVar29 = vpcmpgtq_avx2(auVar45 ^ auVar39,auVar40);
                auVar39 = vpshuflw_avx2(auVar29,0xe8);
                auVar39 = vpermd_avx2(auVar26,auVar36 ^ auVar39);
                auVar4 = vpackssdw_avx(auVar39._0_16_,auVar39._0_16_);
                auVar4 = vpacksswb_avx(auVar4,auVar4);
                if ((auVar4 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar38,2);
                }
                auVar4 = vpackssdw_avx(auVar29._16_16_,auVar29._16_16_);
                auVar4 = vpackssdw_avx(auVar34 ^ auVar4,auVar34 ^ auVar4);
                auVar4 = vpacksswb_avx(auVar4,auVar4);
                if ((auVar4 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar38,3);
                }
                auVar39 = vpor_avx2(auVar27,_DAT_00908c60);
                auVar4 = vpcmpgtq_avx(auVar44 ^ auVar39._0_16_,auVar44 ^ auVar33);
                auVar4 = vpackssdw_avx(auVar4,auVar4);
                auVar29 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar4),0x55);
                auVar29 = vpackssdw_avx2(auVar29,auVar27);
                auVar4 = vpacksswb_avx(auVar29._16_16_,auVar29._16_16_);
                if ((auVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar38,4);
                }
                auVar4 = vpcmpgtq_avx(auVar44 ^ auVar39._0_16_,auVar44 ^ auVar33);
                auVar4 = vpshufhw_avx(auVar4,0x84);
                auVar29 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar4),0x55);
                auVar29 = vpackssdw_avx2(auVar29,auVar27);
                auVar4 = vpacksswb_avx(auVar29._16_16_,auVar29._16_16_);
                if ((auVar4 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar38,5);
                }
                auVar39 = vpcmpgtq_avx2(auVar45 ^ auVar39,auVar40);
                auVar29 = vpackssdw_avx2(auVar27,auVar39);
                auVar29 = vpackssdw_avx2(auVar36 ^ auVar29,auVar27);
                auVar4 = vpacksswb_avx(auVar29._16_16_,auVar29._16_16_);
                if ((auVar4 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar38,6);
                }
                auVar29 = vpackssdw_avx2(auVar27,auVar39);
                auVar29 = vpackssdw_avx2(auVar36 ^ auVar29,auVar27);
                auVar4 = vpacksswb_avx(auVar29._16_16_,auVar29._16_16_);
                if ((auVar4 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar38,7);
                }
                auVar29 = vpor_avx2(auVar27,_DAT_00908e20);
                auVar4 = vpcmpgtq_avx(auVar44 ^ auVar29._0_16_,auVar44 ^ auVar33);
                auVar4 = vpackssdw_avx(auVar4,auVar4);
                auVar4 = vpackssdw_avx(auVar34 ^ auVar4,auVar34 ^ auVar4);
                auVar4 = vpacksswb_avx(auVar4,auVar4);
                auVar38 = auVar25._16_16_;
                if ((auVar4 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar38,0);
                }
                auVar4 = vpcmpgtq_avx(auVar44 ^ auVar29._0_16_,auVar44 ^ auVar33);
                auVar4 = vpackssdw_avx(auVar4,auVar4);
                auVar4 = vpackssdw_avx(auVar34 ^ auVar4,auVar34 ^ auVar4);
                auVar4 = vpacksswb_avx(auVar4,auVar4);
                if ((auVar4 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar38,1);
                }
                auVar25 = vpcmpgtq_avx2(auVar45 ^ auVar29,auVar40);
                auVar29 = vpshuflw_avx2(auVar25,0xe8);
                auVar29 = vpermd_avx2(auVar26,auVar36 ^ auVar29);
                auVar4 = vpackssdw_avx(auVar29._0_16_,auVar29._0_16_);
                auVar4 = vpacksswb_avx(auVar4,auVar4);
                if ((auVar4 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar38,2);
                }
                auVar4 = vpackssdw_avx(auVar25._16_16_,auVar25._16_16_);
                auVar4 = vpackssdw_avx(auVar34 ^ auVar4,auVar34 ^ auVar4);
                auVar4 = vpacksswb_avx(auVar4,auVar4);
                if ((auVar4 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar38,3);
                }
                auVar29 = vpor_avx2(auVar27,_DAT_00908e00);
                auVar4 = vpcmpgtq_avx(auVar44 ^ auVar29._0_16_,auVar44 ^ auVar33);
                auVar4 = vpackssdw_avx(auVar4,auVar4);
                auVar25 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar4),0x55);
                auVar25 = vpackssdw_avx2(auVar29,auVar25);
                auVar4 = vpacksswb_avx(auVar25._16_16_,auVar25._16_16_);
                if ((auVar4 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar38,4);
                }
                auVar4 = vpcmpgtq_avx(auVar44 ^ auVar29._0_16_,auVar44 ^ auVar33);
                auVar4 = vpshufhw_avx(auVar4,0x84);
                auVar25 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar4),0x55);
                auVar25 = vpackssdw_avx2(auVar29,auVar25);
                auVar4 = vpacksswb_avx(auVar25._16_16_,auVar25._16_16_);
                if ((auVar4 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar38,5);
                }
                auVar29 = vpcmpgtq_avx2(auVar45 ^ auVar29,auVar40);
                auVar25 = vpackssdw_avx2(auVar29,auVar29);
                auVar25 = vpackssdw_avx2(auVar29,auVar36 ^ auVar25);
                auVar4 = vpacksswb_avx(auVar25._16_16_,auVar25._16_16_);
                if ((auVar4 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar38,6);
                }
                auVar25 = vpackssdw_avx2(auVar29,auVar29);
                auVar25 = vpackssdw_avx2(auVar36 ^ auVar25,auVar36 ^ auVar25);
                auVar4 = vpacksswb_avx(auVar25._16_16_,auVar25._16_16_);
                if ((auVar4 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar38,7);
                }
                uVar17 = uVar17 + 0x10;
                auVar6 = vpaddd_avx2(auVar6,auVar46);
                auVar7 = vpaddd_avx2(auVar46,auVar7);
              } while ((s2Len + 0xfU & 0xfffffff0) != uVar17);
              uVar17 = 0;
              auVar7._2_2_ = uVar24;
              auVar7._0_2_ = uVar24;
              auVar7._4_2_ = uVar24;
              auVar7._6_2_ = uVar24;
              auVar7._8_2_ = uVar24;
              auVar7._10_2_ = uVar24;
              auVar7._12_2_ = uVar24;
              auVar7._14_2_ = uVar24;
              auVar7._16_2_ = uVar24;
              auVar7._18_2_ = uVar24;
              auVar7._20_2_ = uVar24;
              auVar7._22_2_ = uVar24;
              auVar7._24_2_ = uVar24;
              auVar7._26_2_ = uVar24;
              auVar7._28_2_ = uVar24;
              auVar7._30_2_ = uVar24;
              auVar28 = ZEXT3264(auVar7);
              auVar6._2_2_ = sVar22;
              auVar6._0_2_ = sVar22;
              auVar6._4_2_ = sVar22;
              auVar6._6_2_ = sVar22;
              auVar6._8_2_ = sVar22;
              auVar6._10_2_ = sVar22;
              auVar6._12_2_ = sVar22;
              auVar6._14_2_ = sVar22;
              auVar6._16_2_ = sVar22;
              auVar6._18_2_ = sVar22;
              auVar6._20_2_ = sVar22;
              auVar6._22_2_ = sVar22;
              auVar6._24_2_ = sVar22;
              auVar6._26_2_ = sVar22;
              auVar6._28_2_ = sVar22;
              auVar6._30_2_ = sVar22;
              auVar30 = ZEXT3264(auVar6);
              do {
                palVar18 = ptr;
                ptr = palVar12;
                auVar34 = SUB3216(ptr[(int)size - 1],0);
                auVar36._0_16_ = ZEXT116(0) * auVar34 + ZEXT116(1) * auVar28._0_16_;
                auVar36._16_16_ = ZEXT116(0) * auVar28._16_16_ + ZEXT116(1) * auVar34;
                auVar36 = vpalignr_avx2((undefined1  [32])ptr[(int)size - 1],auVar36,0xe);
                iVar21 = ppVar3->mapper[(byte)s2[uVar17]];
                auVar34 = vpinsrw_avx(auVar36._0_16_,(uint)(ushort)ptr_01[uVar17],0);
                auVar36 = vpblendd_avx2(auVar36,ZEXT1632(auVar34),0xf);
                lVar19 = 0;
                auVar35 = ZEXT3264(auVar7);
                do {
                  auVar26 = vpaddsw_avx2(auVar36,*(undefined1 (*) [32])
                                                  ((long)pvVar2 +
                                                  lVar19 + (long)iVar21 * size * 0x20));
                  auVar36 = *(undefined1 (*) [32])((long)*ptr_00 + lVar19);
                  auVar29 = auVar35._0_32_;
                  auVar25 = vpmaxsw_avx2(auVar36,auVar29);
                  auVar26 = vpmaxsw_avx2(auVar26,auVar25);
                  *(undefined1 (*) [32])((long)*palVar18 + lVar19) = auVar26;
                  auVar25 = vpmaxsw_avx2(auVar28._0_32_,auVar26);
                  auVar28 = ZEXT3264(auVar25);
                  auVar25 = vpminsw_avx2(auVar30._0_32_,auVar36);
                  auVar25 = vpminsw_avx2(auVar25,auVar29);
                  auVar25 = vpminsw_avx2(auVar25,auVar26);
                  auVar30 = ZEXT3264(auVar25);
                  auVar26 = vpsubsw_avx2(auVar26,auVar31);
                  auVar36 = vpsubsw_avx2(auVar36,auVar32);
                  auVar36 = vpmaxsw_avx2(auVar36,auVar26);
                  *(undefined1 (*) [32])((long)*ptr_00 + lVar19) = auVar36;
                  auVar36 = vpsubsw_avx2(auVar29,auVar32);
                  auVar36 = vpmaxsw_avx2(auVar36,auVar26);
                  auVar35 = ZEXT3264(auVar36);
                  auVar36 = *(undefined1 (*) [32])((long)*ptr + lVar19);
                  lVar19 = lVar19 + 0x20;
                } while (size * 0x20 != lVar19);
                iVar21 = 0;
                do {
                  iVar16 = ptr_01[uVar17 + 1] - open;
                  if (ptr_01[uVar17 + 1] - open < -0x7fff) {
                    iVar16 = -0x8000;
                  }
                  auVar37._0_16_ = ZEXT116(0) * auVar35._0_16_ + ZEXT116(1) * auVar28._0_16_;
                  auVar37._16_16_ = ZEXT116(0) * auVar28._16_16_ + ZEXT116(1) * auVar35._0_16_;
                  auVar36 = vpalignr_avx2(auVar35._0_32_,auVar37,0xe);
                  auVar34 = vpinsrw_avx(auVar36._0_16_,iVar16,0);
                  auVar36 = vpblendd_avx2(auVar36,ZEXT1632(auVar34),0xf);
                  auVar35 = ZEXT3264(auVar36);
                  lVar19 = 0;
                  do {
                    auVar36 = vpmaxsw_avx2(auVar35._0_32_,
                                           *(undefined1 (*) [32])((long)*palVar18 + lVar19));
                    *(undefined1 (*) [32])((long)*palVar18 + lVar19) = auVar36;
                    auVar25 = vpminsw_avx2(auVar30._0_32_,auVar36);
                    auVar30 = ZEXT3264(auVar25);
                    auVar26 = vpmaxsw_avx2(auVar28._0_32_,auVar36);
                    auVar28 = ZEXT3264(auVar26);
                    auVar36 = vpsubsw_avx2(auVar36,auVar31);
                    auVar29 = vpsubsw_avx2(auVar35._0_32_,auVar32);
                    auVar35 = ZEXT3264(auVar29);
                    auVar36 = vpcmpgtw_avx2(auVar29,auVar36);
                    if ((((((((((((((((((((((((((((((((auVar36 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar36 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar36 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar36 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar36 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar36 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar36 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar36 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar36 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar36 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar36 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar36 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar36 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar36 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar36 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar36 >> 0x7f,0) == '\0')
                                      && (auVar36 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar36 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar36 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar36 >> 0x9f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar36 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar36 >> 0xaf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar36 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar36 >> 0xbf,0) == '\0') &&
                              (auVar36 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar36 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar36 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar36 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar36 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar36 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar36 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar36[0x1f]) goto LAB_00775bd1;
                    lVar19 = lVar19 + 0x20;
                  } while (size * 0x20 != lVar19);
                  iVar21 = iVar21 + 1;
                } while (iVar21 != 0x10);
LAB_00775bd1:
                uVar17 = uVar17 + 1;
                palVar12 = palVar18;
                if (uVar17 == (uint)s2Len) {
                  alVar10 = palVar18[(ulong)uVar15 % size];
                  auVar34 = alVar10._16_16_;
                  if (iVar23 < 0xf) {
                    iVar21 = 0;
                    do {
                      auVar36 = vperm2i128_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar10,
                                                0x28);
                      alVar10 = (__m256i)vpalignr_avx2((undefined1  [32])alVar10,auVar36,0xe);
                      auVar34 = alVar10._16_16_;
                      iVar21 = iVar21 + 1;
                    } while (iVar21 < 0xf - iVar23);
                  }
                  auVar7 = vpcmpgtw_avx2(auVar7,auVar25);
                  auVar6 = vpcmpgtw_avx2(auVar26,auVar6);
                  auVar6 = vpor_avx2(auVar6,auVar7);
                  if ((((((((((((((((((((((((((((((((auVar6 >> 7 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0 &&
                                                   (auVar6 >> 0xf & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar6 >> 0x17 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar6 >> 0x1f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar6 >> 0x27 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar6 >> 0x2f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar6 >> 0x37 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar6 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar6 >> 0x47 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar6 >> 0x4f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar6 >> 0x57 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar6 >> 0x5f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar6 >> 0x67 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar6 >> 0x6f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar6 >> 0x77 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar6 >> 0x7f,0) == '\0') &&
                                    (auVar6 >> 0x87 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar6 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   ) && (auVar6 >> 0x97 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                 (auVar6 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                && (auVar6 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (auVar6 >> 0xaf & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (auVar6 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             SUB321(auVar6 >> 0xbf,0) == '\0') &&
                            (auVar6 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar6 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar6 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar6 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar6 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar6 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar6 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      -1 < auVar6[0x1f]) {
                    uVar14 = vpextrw_avx(auVar34,7);
                    sVar22 = (short)uVar14;
                  }
                  else {
                    *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
                    sVar22 = 0;
                    iVar13 = 0;
                    uVar15 = 0;
                  }
                  ppVar11->score = (int)sVar22;
                  ppVar11->end_query = uVar15;
                  ppVar11->end_ref = iVar13;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  parasail_free(palVar18);
                  return ppVar11;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int16_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_16_t h;
            __m256i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi16_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi16(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi16(vH, vE);
            vH = _mm256_max_epi16(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_subs_epi16(vH, vGapO);
            vE = _mm256_subs_epi16(vE, vGapE);
            vE = _mm256_max_epi16(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi16(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_subs_epi16(vH, vGapO);
                vF = _mm256_subs_epi16(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm256_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 2);
        }
        score = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}